

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseUninterpretedBlock(Parser *this,string *value)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  ErrorMaker local_68;
  string_view local_58;
  string_view local_48;
  int local_34;
  undefined1 auStack_30 [4];
  int brace_depth;
  string *local_20;
  string *value_local;
  Parser *this_local;
  
  local_20 = value;
  value_local = (string *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,"{");
  bVar2 = Consume(this,_auStack_30);
  if (bVar2) {
    local_34 = 1;
    while (bVar2 = AtEnd(this), ((bVar2 ^ 0xffU) & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"{");
      bVar2 = LookingAt(this,local_48);
      if (bVar2) {
        local_34 = local_34 + 1;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"}");
        bVar2 = LookingAt(this,local_58);
        if ((bVar2) && (local_34 = local_34 + -1, local_34 == 0)) {
          io::Tokenizer::Next(this->input_);
          return true;
        }
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::push_back((char)local_20);
      }
      psVar1 = local_20;
      io::Tokenizer::current(this->input_);
      std::__cxx11::string::append((string *)psVar1);
      io::Tokenizer::Next(this->input_);
    }
    ErrorMaker::ErrorMaker(&local_68,"Unexpected end of stream while parsing aggregate value.");
    RecordError(this,local_68);
  }
  return false;
}

Assistant:

bool Parser::ParseUninterpretedBlock(std::string* value) {
  // Note that enclosing braces are not added to *value.
  // We do NOT use ConsumeEndOfStatement for this brace because it's delimiting
  // an expression, not a block of statements.
  DO(Consume("{"));
  int brace_depth = 1;
  while (!AtEnd()) {
    if (LookingAt("{")) {
      brace_depth++;
    } else if (LookingAt("}")) {
      brace_depth--;
      if (brace_depth == 0) {
        input_->Next();
        return true;
      }
    }
    // TODO: Interpret line/column numbers to preserve formatting
    if (!value->empty()) value->push_back(' ');
    value->append(input_->current().text);
    input_->Next();
  }
  RecordError("Unexpected end of stream while parsing aggregate value.");
  return false;
}